

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall
Application::onMessage(Application *this,NewOrderSingle *message,SessionID *sessionID)

{
  char cVar1;
  bool bVar2;
  FieldBase *field;
  IncorrectTagValue *this_00;
  FieldBase local_6b0;
  double local_658;
  double local_650;
  QTY local_648;
  string local_640;
  string local_620;
  OrderQty orderQty;
  FieldBase local_5a8;
  Price price;
  OrdType ordType;
  Account account;
  ClOrdID clOrdID;
  Side side;
  Symbol symbol;
  FieldBase local_340;
  FieldBase local_2e8;
  ExecutionReport executionReport;
  FieldBase local_138;
  FieldBase local_e0;
  FieldBase local_88;
  
  FIX::Symbol::Symbol(&symbol);
  FIX::Side::Side(&side);
  FIX::OrdType::OrdType(&ordType);
  FIX::OrderQty::OrderQty(&orderQty);
  FIX::Price::Price(&price);
  FIX::ClOrdID::ClOrdID(&clOrdID);
  FIX::Account::Account(&account);
  FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&ordType);
  cVar1 = FIX::CharField::getValue(&ordType.super_CharField);
  if (cVar1 == '2') {
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&symbol);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&side);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&orderQty);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&price);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&clOrdID);
    genOrderID_abi_cxx11_(&local_620,this);
    FIX::OrderID::OrderID((OrderID *)&local_6b0,&local_620);
    genExecID_abi_cxx11_(&local_640,this);
    FIX::ExecID::ExecID((ExecID *)&local_5a8,&local_640);
    FIX::ExecType::ExecType((ExecType *)&local_2e8,"F11Application");
    FIX::OrdStatus::OrdStatus((OrdStatus *)&local_340,"22F11Application");
    local_648 = 0.0;
    FIX::LeavesQty::LeavesQty((LeavesQty *)&local_88,&local_648);
    local_650 = FIX::DoubleField::getValue(&orderQty.super_QtyField);
    FIX::CumQty::CumQty((CumQty *)&local_e0,&local_650);
    local_658 = FIX::DoubleField::getValue(&price.super_PriceField);
    FIX::AvgPx::AvgPx((AvgPx *)&local_138,&local_658);
    FIX44::ExecutionReport::ExecutionReport
              (&executionReport,(OrderID *)&local_6b0,(ExecID *)&local_5a8,(ExecType *)&local_2e8,
               (OrdStatus *)&local_340,&side,(LeavesQty *)&local_88,(CumQty *)&local_e0,
               (AvgPx *)&local_138);
    FIX::FieldBase::~FieldBase(&local_138);
    FIX::FieldBase::~FieldBase(&local_e0);
    FIX::FieldBase::~FieldBase(&local_88);
    FIX::FieldBase::~FieldBase(&local_340);
    FIX::FieldBase::~FieldBase(&local_2e8);
    FIX::FieldBase::~FieldBase(&local_5a8);
    std::__cxx11::string::~string((string *)&local_640);
    FIX::FieldBase::~FieldBase(&local_6b0);
    std::__cxx11::string::~string((string *)&local_620);
    FIX44::ExecutionReport::set(&executionReport,&clOrdID);
    FIX44::ExecutionReport::set(&executionReport,&symbol);
    FIX44::ExecutionReport::set(&executionReport,&orderQty);
    local_5a8._vptr_FieldBase = (_func_int **)FIX::DoubleField::getValue(&orderQty.super_QtyField);
    FIX::LastQty::LastQty((LastQty *)&local_6b0,(QTY *)&local_5a8);
    FIX44::ExecutionReport::set(&executionReport,(LastQty *)&local_6b0);
    FIX::FieldBase::~FieldBase(&local_6b0);
    local_5a8._vptr_FieldBase = (_func_int **)FIX::DoubleField::getValue(&price.super_PriceField);
    FIX::LastPx::LastPx((LastPx *)&local_6b0,(PRICE *)&local_5a8);
    FIX44::ExecutionReport::set(&executionReport,(LastPx *)&local_6b0);
    FIX::FieldBase::~FieldBase(&local_6b0);
    bVar2 = FIX::FieldMap::isSetField
                      ((FieldMap *)message,account.super_StringField.super_FieldBase.m_tag);
    if (bVar2) {
      field = FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&account);
      FIX::FieldMap::setField((FieldMap *)&executionReport,field,true);
    }
    FIX::Session::sendToTarget((Message *)&executionReport,sessionID);
    FIX::Message::~Message((Message *)&executionReport);
    FIX::FieldBase::~FieldBase((FieldBase *)&account);
    FIX::FieldBase::~FieldBase((FieldBase *)&clOrdID);
    FIX::FieldBase::~FieldBase((FieldBase *)&price);
    FIX::FieldBase::~FieldBase((FieldBase *)&orderQty);
    FIX::FieldBase::~FieldBase((FieldBase *)&ordType);
    FIX::FieldBase::~FieldBase((FieldBase *)&side);
    FIX::FieldBase::~FieldBase((FieldBase *)&symbol);
    return;
  }
  this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&executionReport,"",(allocator<char> *)&local_6b0);
  FIX::IncorrectTagValue::IncorrectTagValue
            (this_00,ordType.super_CharField.super_FieldBase.m_tag,(string *)&executionReport);
  __cxa_throw(this_00,&FIX::IncorrectTagValue::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void Application::onMessage(const FIX44::NewOrderSingle &message, const FIX::SessionID &sessionID) {
  FIX::Symbol symbol;
  FIX::Side side;
  FIX::OrdType ordType;
  FIX::OrderQty orderQty;
  FIX::Price price;
  FIX::ClOrdID clOrdID;
  FIX::Account account;

  message.get(ordType);

  if (ordType != FIX::OrdType_LIMIT) {
    throw FIX::IncorrectTagValue(ordType.getTag());
  }

  message.get(symbol);
  message.get(side);
  message.get(orderQty);
  message.get(price);
  message.get(clOrdID);

  FIX44::ExecutionReport executionReport = FIX44::ExecutionReport(
      FIX::OrderID(genOrderID()),
      FIX::ExecID(genExecID()),
      FIX::ExecType(FIX::ExecType_TRADE),
      FIX::OrdStatus(FIX::OrdStatus_FILLED),
      side,
      FIX::LeavesQty(0),
      FIX::CumQty(orderQty),
      FIX::AvgPx(price));

  executionReport.set(clOrdID);
  executionReport.set(symbol);
  executionReport.set(orderQty);
  executionReport.set(FIX::LastQty(orderQty));
  executionReport.set(FIX::LastPx(price));

  if (message.isSet(account)) {
    executionReport.setField(message.get(account));
  }

  try {
    FIX::Session::sendToTarget(executionReport, sessionID);
  } catch (FIX::SessionNotFound &) {}
}